

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-virt.c
# Opt level: O0

void * mem_alloc(size_t len)

{
  void *p;
  size_t len_local;
  
  if (len == 0) {
    len_local = 0;
  }
  else {
    len_local = (size_t)malloc(len);
    if ((void *)len_local == (void *)0x0) {
      quit("Out of memory!");
    }
  }
  return (void *)len_local;
}

Assistant:

void *mem_alloc(size_t len)
{
	/* Note: standard malloc(3) returns a non-null pointer if passed
	 * a length of 0. Not quite sure why Angband's wrapper has this
	 * behavior. */
	if (!len)
		return NULL;

	void *p = malloc(len);
	if (!p)
		quit("Out of memory!");
	return p;
}